

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::push_back
          (small_vector<pstore::command_line::literal,_3UL> *this,literal *v)

{
  bool bVar1;
  size_t elements;
  reference this_00;
  size_t new_elements;
  literal *v_local;
  small_vector<pstore::command_line::literal,_3UL> *this_local;
  
  elements = this->elements_ + 1;
  bVar1 = is_small(elements);
  if (bVar1) {
    this_00 = std::array<pstore::command_line::literal,_3UL>::operator[]
                        (&this->small_buffer_,this->elements_);
    command_line::literal::operator=(this_00,v);
  }
  else {
    bVar1 = is_small(this->elements_);
    if (bVar1) {
      switch_to_big(this,elements);
    }
    std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
    push_back(&this->big_buffer_,v);
    set_buffer_ptr(this,elements);
  }
  this->elements_ = elements;
  return;
}

Assistant:

inline void small_vector<ElementType, BodyElements>::push_back (ElementType const & v) {
        auto const new_elements = elements_ + 1U;
        if (is_small (new_elements)) {
            small_buffer_[elements_] = v;
        } else {
            if (is_small (elements_)) {
                this->switch_to_big (new_elements);
            }
            big_buffer_.push_back (v);
            this->set_buffer_ptr (new_elements);
        }
        elements_ = new_elements;
    }